

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O1

int get_port(SOCKET sockfd,uint16_t *port)

{
  int iVar1;
  socklen_t len;
  sockaddr_storage sockinfo;
  socklen_t local_9c;
  sockaddr local_98 [8];
  
  local_9c = 0x80;
  iVar1 = getsockname(sockfd,local_98,&local_9c);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    if ((local_98[0].sa_family | 8) == 10) {
      *port = local_98[0].sa_data._0_2_ << 8 | (ushort)local_98[0].sa_data._0_2_ >> 8;
    }
    iVar1 = 0;
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x2e0,
               "sockfd = %d, .... port = %d\n",sockfd,(uint)*port);
  }
  return iVar1;
}

Assistant:

static int get_port(
	/*! [in] Socket descriptor. */
	SOCKET sockfd,
	/*! [out] The port value if successful, otherwise, untouched. */
	uint16_t *port)
{
	struct sockaddr_storage sockinfo;
	socklen_t len;
	int code;

	len = sizeof(sockinfo);
	code = getsockname(sockfd, (struct sockaddr *)&sockinfo, &len);
	if (code == -1) {
		return -1;
	}
	if (sockinfo.ss_family == AF_INET) {
		*port = ntohs(((struct sockaddr_in *)&sockinfo)->sin_port);
	} else if (sockinfo.ss_family == AF_INET6) {
		*port = ntohs(((struct sockaddr_in6 *)&sockinfo)->sin6_port);
	}
	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"sockfd = %d, .... port = %d\n",
		sockfd,
		(int)*port);

	return 0;
}